

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManComputeCutLo(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    uVar6 = pVVar4->nCap;
    iVar1 = pVVar4->nSize;
    ppvVar5 = pVVar4->pArray;
    lVar8 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar8];
      if (iVar1 + (int)lVar8 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          uVar6 = 0x10;
        }
        else {
          uVar3 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar3) != 0 < (int)uVar6) {
            uVar6 = uVar3;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar3 << 3);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar3 << 3);
            }
          }
        }
      }
      ppvVar5[iVar1 + lVar8] = pvVar2;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCis;
    } while (lVar8 < pVVar7->nSize);
    pVVar4->nSize = iVar1 + (int)lVar8;
    pVVar4->nCap = uVar6;
    pVVar4->pArray = ppvVar5;
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLo( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_PtrPush( vMinCut, pObj );
    return vMinCut;
}